

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibPrintObj(Sfm_Lib_t *p,Sfm_Fun_t *pObj)

{
  int *piVar1;
  char *pcVar2;
  uint uVar3;
  char *pFanins2;
  Mio_Cell2_t *pCell2;
  int iVar4;
  uint uVar5;
  Mio_Cell2_t *pMVar6;
  Mio_Cell2_t *pMVar7;
  ulong uVar8;
  
  pMVar6 = p->pCells;
  pMVar7 = pMVar6 + pObj->pFansT[0];
  if ((long)pObj->pFansT[0] == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = (*(uint *)&pMVar7->field_0x10 >> 0x1c) - 1;
  }
  uVar5 = iVar4 + (*(uint *)&pMVar6[pObj->pFansB[0]].field_0x10 >> 0x1c);
  pMVar6 = pMVar6 + pObj->pFansB[0];
  printf("F = %d  A =%6.2f  ",(double)pObj->Area * 0.001,(ulong)uVar5);
  if (pMVar7 == p->pCells) {
    pcVar2 = pObj->pFansB;
    pCell2 = (Mio_Cell2_t *)0x0;
    pFanins2 = (char *)0x0;
  }
  else {
    pcVar2 = pObj->pFansT;
    pFanins2 = pObj->pFansB + 1;
    pCell2 = pMVar6;
    pMVar6 = pMVar7;
  }
  Sfm_LibPrintGate(pMVar6,pcVar2 + 1,pCell2,pFanins2);
  if (p->fDelay != 0) {
    uVar3 = (int)((long)pObj - (long)p->pObjs >> 2) * -0x49249249;
    if (((int)uVar3 < 0) || ((p->vProfs).nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar3 = (p->vProfs).pArray[uVar3 & 0x7fffffff];
    if (((int)uVar3 < 0) || ((p->vStore).nSize <= (int)uVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    if (0 < (int)uVar5) {
      piVar1 = (p->vStore).pArray;
      uVar8 = 0;
      do {
        printf("%6.2f ",(double)piVar1[uVar3 + uVar8] * 0.001);
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
  }
  return;
}

Assistant:

void Sfm_LibPrintObj( Sfm_Lib_t * p, Sfm_Fun_t * pObj )
{
    Mio_Cell2_t * pCellB = p->pCells + (int)pObj->pFansB[0];
    Mio_Cell2_t * pCellT = p->pCells + (int)pObj->pFansT[0];
    int i, nFanins = pCellB->nFanins + (pCellT == p->pCells ? 0 : pCellT->nFanins - 1);
    printf( "F = %d  A =%6.2f  ", nFanins, MIO_NUMINV*pObj->Area );
    if ( pCellT == p->pCells )
        Sfm_LibPrintGate( pCellB, pObj->pFansB + 1, NULL, NULL );
    else
        Sfm_LibPrintGate( pCellT, pObj->pFansT + 1, pCellB, pObj->pFansB + 1 );
    // get hold of delay info
    if ( p->fDelay )
    {
        int Offset  = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
        int * pProf = Vec_IntEntryP( &p->vStore, Offset );
        for ( i = 0; i < nFanins; i++ )
            printf( "%6.2f ", MIO_NUMINV*pProf[i] );
    }
}